

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::readImageAspect
          (CopiesAndBlittingTestInstance *this,VkImage image,PixelBufferAccess *dst,
          ImageParms *imageParms)

{
  deUint64 dVar1;
  VkCommandBuffer_s *pVVar2;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  deUint32 *pdVar3;
  deUint32 dVar4;
  VkResult VVar5;
  VkImageAspectFlags VVar6;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  MovePtr *this_00;
  ulong numBytes;
  Handle<(vk::HandleType)8> *pHVar7;
  Allocation *pAVar8;
  VkDeviceMemory VVar9;
  VkDeviceSize VVar10;
  void *pvVar11;
  TextureFormat format;
  TextureFormat *pTVar12;
  VkCommandBuffer_s **ppVVar13;
  IVec3 *size;
  undefined4 uVar14;
  undefined4 uVar15;
  ConstPixelBufferAccess local_338;
  VkDeviceMemory local_310;
  deUint64 local_308;
  deUint64 local_300;
  undefined8 uStack_2f8;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  undefined8 local_2d0;
  VkBufferImageCopy copyRegion;
  undefined4 local_288;
  VkImageAspectFlags aspect;
  VkImageMemoryBarrier postImageBarrier;
  VkBufferMemoryBarrier bufferBarrier;
  VkImageMemoryBarrier imageBarrier;
  VkImageAspectFlags formatAspect;
  VkMemoryRequirements local_188;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_170;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_160;
  Move<vk::Handle<(vk::HandleType)8>_> local_150;
  RefData<vk::Handle<(vk::HandleType)8>_> local_130;
  undefined1 local_110 [8];
  VkBufferCreateInfo bufferParams;
  deUint32 local_d0;
  VkExtent3D imageExtent;
  VkDeviceSize pixelDataSize;
  deUint32 queueFamilyIndex;
  undefined1 local_78 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  Allocator *allocator;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  ImageParms *imageParms_local;
  PixelBufferAccess *dst_local;
  CopiesAndBlittingTestInstance *this_local;
  VkImage image_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  this_00 = (MovePtr *)Context::getDefaultAllocator((this->super_TestInstance).m_context);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  pixelDataSize._0_4_ = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&imageExtent.depth,&dst->super_ConstPixelBufferAccess);
  dVar4 = calculateSize(this,(ConstPixelBufferAccess *)&imageExtent.depth);
  numBytes = (ulong)dVar4;
  join_0x00000010_0x00000000_ = getExtent3D(imageParms);
  imageExtent.width = local_d0;
  pdVar3 = bufferParams.pQueueFamilyIndices;
  local_110._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferParams._4_4_ = 0;
  bufferParams.pNext._0_4_ = 0;
  bufferParams.size._0_4_ = 2;
  bufferParams.size._4_4_ = 0;
  bufferParams.usage = 1;
  bufferParams._40_8_ = &pixelDataSize;
  bufferParams._16_8_ = numBytes;
  ::vk::createBuffer(&local_150,vk_00,device_00,(VkBufferCreateInfo *)local_110,
                     (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_130,(Move *)&local_150);
  uVar14 = SUB84(local_130.deleter.m_deviceIface,0);
  uVar15 = (undefined4)((ulong)local_130.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_deviceIface._0_4_ = uVar14;
  data_00.object.m_internal = local_130.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = uVar15;
  data_00.deleter.m_device = local_130.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_130.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_130.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_150);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      &bufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                       field_0x8);
  ::vk::getBufferMemoryRequirements(&local_188,vk_00,device_00,(VkBuffer)pHVar7->m_internal);
  (*(*(_func_int ***)this_00)[3])
            (&local_170,this_00,&local_188,(ulong)::vk::MemoryRequirement::HostVisible);
  local_160 = de::details::MovePtr::operator_cast_to_PtrData(&local_170,this_00);
  data._8_4_ = uVar14;
  data.ptr = (Allocation *)local_130.object.m_internal;
  data._12_4_ = uVar15;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_170);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      &bufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                       field_0x8);
  dVar1 = pHVar7->m_internal;
  pAVar8 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  VVar9 = ::vk::Allocation::getMemory(pAVar8);
  pAVar8 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  VVar10 = ::vk::Allocation::getOffset(pAVar8);
  VVar5 = (*vk_00->_vptr_DeviceInterface[0xc])(vk_00,device_00,dVar1,VVar9.m_internal,VVar10);
  ::vk::checkResult(VVar5,
                    "vk.bindBufferMemory(device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x22f);
  pAVar8 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  pvVar11 = ::vk::Allocation::getHostPtr(pAVar8);
  ::deMemset(pvVar11,0,numBytes);
  pAVar8 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  VVar9 = ::vk::Allocation::getMemory(pAVar8);
  pAVar8 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  VVar10 = ::vk::Allocation::getOffset(pAVar8);
  ::vk::flushMappedMemoryRange(vk_00,device_00,VVar9,VVar10,numBytes);
  format = ::vk::mapVkFormat(imageParms->format);
  VVar6 = getAspectFlags(format);
  bufferBarrier.size._0_4_ = 0x2d;
  getArraySize(imageParms);
  postImageBarrier.subresourceRange.layerCount = 0x2c;
  bufferBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferBarrier._4_4_ = 0;
  bufferBarrier.pNext._0_4_ = 0x1000;
  bufferBarrier.pNext._4_4_ = 0x2000;
  bufferBarrier.srcAccessMask = 0xffffffff;
  bufferBarrier.dstAccessMask = 0xffffffff;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      &bufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                       field_0x8);
  bufferBarrier._24_8_ = pHVar7->m_internal;
  bufferBarrier.buffer.m_internal = 0;
  local_288 = 0x2d;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext._0_4_ = 0x800;
  postImageBarrier.pNext._4_4_ = 0x1000;
  postImageBarrier.srcAccessMask = 6;
  postImageBarrier.dstAccessMask = imageParms->operationLayout;
  postImageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.image.m_internal._4_4_ = 0;
  postImageBarrier.subresourceRange.aspectMask = 1;
  postImageBarrier.subresourceRange.baseMipLevel = 0;
  postImageBarrier._32_8_ = image.m_internal;
  postImageBarrier.image.m_internal._0_4_ = VVar6;
  bufferBarrier.offset = numBytes;
  postImageBarrier.subresourceRange.levelCount = getArraySize(imageParms);
  pTVar12 = tcu::ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
  copyRegion.imageExtent._4_8_ = *pTVar12;
  VVar6 = getAspectFlags((TextureFormat)copyRegion.imageExtent._4_8_);
  local_2d0 = 0;
  copyRegion.bufferOffset._0_4_ =
       tcu::ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
  copyRegion.bufferOffset._4_4_ =
       tcu::ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.bufferRowLength = VVar6;
  copyRegion.imageSubresource.mipLevel = getArraySize(imageParms);
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  copyRegion.imageOffset.x = 0;
  copyRegion.imageExtent.width = imageExtent.width;
  copyRegion.imageOffset._4_8_ = pdVar3;
  cmdBufferBeginInfo.pNext = (void *)0x1;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  uStack_2f8 = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar5 = (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,*ppVVar13,&uStack_2f8);
  ::vk::checkResult(VVar5,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x285);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar13,0x1000,0x1000,0,0,0,0,0,1,&bufferBarrier.size);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar13;
  local_300 = image.m_internal;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      &bufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                       field_0x8);
  local_308 = pHVar7->m_internal;
  (*vk_00->_vptr_DeviceInterface[99])(vk_00,pVVar2,local_300,6,local_308,1,&local_2d0);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar13,0x1000,0x5000,0,0,0,1,&postImageBarrier.subresourceRange.layerCount,1,
             &local_288);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar5 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar13);
  ::vk::checkResult(VVar5,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x289);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  submitCommandsAndWait(this,vk_00,device_00,queue_00,ppVVar13);
  pAVar8 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  local_310 = ::vk::Allocation::getMemory(pAVar8);
  pAVar8 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  VVar10 = ::vk::Allocation::getOffset(pAVar8);
  ::vk::invalidateMappedMemoryRange(vk_00,device_00,local_310,VVar10,numBytes);
  pTVar12 = tcu::ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
  size = tcu::ConstPixelBufferAccess::getSize(&dst->super_ConstPixelBufferAccess);
  pAVar8 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  pvVar11 = ::vk::Allocation::getHostPtr(pAVar8);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_338,pTVar12,size,pvVar11);
  tcu::copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)&local_338);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  return;
}

Assistant:

void CopiesAndBlittingTestInstance::readImageAspect (vk::VkImage					image,
													 const tcu::PixelBufferAccess&	dst,
													 const ImageParms&				imageParms)
{
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();
	const VkQueue				queue				= m_context.getUniversalQueue();
	Allocator&					allocator			= m_context.getDefaultAllocator();

	Move<VkBuffer>				buffer;
	de::MovePtr<Allocation>		bufferAlloc;
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	const VkDeviceSize			pixelDataSize		= calculateSize(dst);
	const VkExtent3D			imageExtent			= getExtent3D(imageParms);

	// Create destination buffer
	{
		const VkBufferCreateInfo			bufferParams			=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			pixelDataSize,								// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
		};

		buffer		= createBuffer(vk, device, &bufferParams);
		bufferAlloc	= allocator.allocate(getBufferMemoryRequirements(vk, device, *buffer), MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));

		deMemset(bufferAlloc->getHostPtr(), 0, static_cast<size_t>(pixelDataSize));
		flushMappedMemoryRange(vk, device, bufferAlloc->getMemory(), bufferAlloc->getOffset(), pixelDataSize);
	}

	// Barriers for copying image to buffer
	const VkImageAspectFlags				formatAspect			= getAspectFlags(mapVkFormat(imageParms.format));
	const VkImageMemoryBarrier				imageBarrier			=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			dstAccessMask;
		imageParms.operationLayout,					// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					dstQueueFamilyIndex;
		image,										// VkImage					image;
		{											// VkImageSubresourceRange	subresourceRange;
			formatAspect,			// VkImageAspectFlags	aspectMask;
			0u,						// deUint32				baseMipLevel;
			1u,						// deUint32				mipLevels;
			0u,						// deUint32				baseArraySlice;
			getArraySize(imageParms)// deUint32				arraySize;
		}
	};

	const VkBufferMemoryBarrier				bufferBarrier			=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags	srcAccessMask;
		VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*buffer,									// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		pixelDataSize								// VkDeviceSize		size;
	};

	const VkImageMemoryBarrier				postImageBarrier		=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			oldLayout;
		imageParms.operationLayout,					// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					dstQueueFamilyIndex;
		image,										// VkImage					image;
		{
			formatAspect,								// VkImageAspectFlags	aspectMask;
			0u,											// deUint32				baseMipLevel;
			1u,											// deUint32				mipLevels;
			0u,											// deUint32				baseArraySlice;
			getArraySize(imageParms)					// deUint32				arraySize;
		}											// VkImageSubresourceRange	subresourceRange;
	};

	// Copy image to buffer
	const VkImageAspectFlags	aspect			= getAspectFlags(dst.getFormat());
	const VkBufferImageCopy		copyRegion		=
	{
		0u,									// VkDeviceSize				bufferOffset;
		(deUint32)dst.getWidth(),			// deUint32					bufferRowLength;
		(deUint32)dst.getHeight(),			// deUint32					bufferImageHeight;
		{
			aspect,								// VkImageAspectFlags		aspect;
			0u,									// deUint32					mipLevel;
			0u,									// deUint32					baseArrayLayer;
			getArraySize(imageParms),			// deUint32					layerCount;
		},									// VkImageSubresourceLayers	imageSubresource;
		{ 0, 0, 0 },						// VkOffset3D				imageOffset;
		imageExtent							// VkExtent3D				imageExtent;
	};

	const VkCommandBufferBeginInfo			cmdBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,			// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &imageBarrier);
	vk.cmdCopyImageToBuffer(*m_cmdBuffer, image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *buffer, 1u, &copyRegion);
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT|VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &bufferBarrier, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));

	submitCommandsAndWait(vk, device, queue, *m_cmdBuffer);

	// Read buffer data
	invalidateMappedMemoryRange(vk, device, bufferAlloc->getMemory(), bufferAlloc->getOffset(), pixelDataSize);
	tcu::copy(dst, tcu::ConstPixelBufferAccess(dst.getFormat(), dst.getSize(), bufferAlloc->getHostPtr()));
}